

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_equal_mem(char *file,wchar_t line,void *_v1,char *e1,void *_v2,char *e2,size_t l,
                           char *ld,void *extra)

{
  int iVar1;
  undefined8 in_RCX;
  void *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  void *in_R8;
  undefined8 in_R9;
  ulong in_stack_00000008;
  undefined8 in_stack_00000010;
  size_t offset;
  char *v2;
  char *v1;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  char *p;
  void *local_48;
  void *local_40;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  if ((in_RDX == in_R8) ||
     (((in_RDX != (void *)0x0 && (in_R8 != (void *)0x0)) &&
      (iVar1 = memcmp(in_RDX,in_R8,in_stack_00000008), iVar1 == 0)))) {
    local_4 = L'\x01';
  }
  else if ((in_RDX == (void *)0x0) || (in_R8 == (void *)0x0)) {
    local_4 = L'\0';
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"%s != %s",in_RCX,in_R9);
    logprintf("      size %s = %d\n",in_stack_00000010,in_stack_00000008 & 0xffffffff);
    p = (char *)0x0;
    local_48 = in_R8;
    local_40 = in_RDX;
    while( true ) {
      uVar2 = false;
      if (0x40 < in_stack_00000008) {
        iVar1 = memcmp(local_40,local_48,0x20);
        uVar2 = iVar1 == 0;
      }
      if ((bool)uVar2 == false) break;
      local_40 = (void *)((long)local_40 + 0x10);
      local_48 = (void *)((long)local_48 + 0x10);
      in_stack_00000008 = in_stack_00000008 - 0x10;
      p = p + 0x10;
    }
    logprintf("      Dump of %s\n",in_RCX);
    hexdump(p,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),(size_t)local_48,(size_t)local_40);
    logprintf("      Dump of %s\n",in_R9);
    hexdump(p,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),(size_t)local_48,(size_t)local_40);
    logprintf("\n");
    failure_finish((void *)0x104743);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_equal_mem(const char *file, int line,
    const void *_v1, const char *e1,
    const void *_v2, const char *e2,
    size_t l, const char *ld, void *extra)
{
	const char *v1 = (const char *)_v1;
	const char *v2 = (const char *)_v2;
	size_t offset;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && memcmp(v1, v2, l) == 0))
		return (1);
	if (v1 == NULL || v2 == NULL)
		return (0);

	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      size %s = %d\n", ld, (int)l);
	/* Dump 48 bytes (3 lines) so that the first difference is
	 * in the second line. */
	offset = 0;
	while (l > 64 && memcmp(v1, v2, 32) == 0) {
		/* Two lines agree, so step forward one line. */
		v1 += 16;
		v2 += 16;
		l -= 16;
		offset += 16;
	}
	logprintf("      Dump of %s\n", e1);
	hexdump(v1, v2, l < 128 ? l : 128, offset);
	logprintf("      Dump of %s\n", e2);
	hexdump(v2, v1, l < 128 ? l : 128, offset);
	logprintf("\n");
	failure_finish(extra);
	return (0);
}